

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O1

int Ssc_GiaSimulatePattern_rec(Ssc_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Man_t *pGVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  
  pGVar1 = p->pAig;
  pGVar2 = pGVar1->pObjs;
  if ((pObj < pGVar2) || (pGVar2 + pGVar1->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar6 = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
  if (pGVar1->nTravIdsAlloc <= iVar6) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (pGVar1->pTravIds[iVar6] == pGVar1->nTravIds) {
    uVar5 = *(ulong *)pObj;
  }
  else {
    pGVar1->pTravIds[iVar6] = pGVar1->nTravIds;
    uVar3 = pObj->Value;
    if (uVar3 == 0xffffffff) {
      uVar3 = Ssc_GiaSimulatePattern_rec(p,pObj + -(*(ulong *)pObj & 0x1fffffff));
      uVar4 = Ssc_GiaSimulatePattern_rec(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
      uVar5 = *(ulong *)pObj;
      uVar3 = ((uint)(uVar5 >> 0x3d) & 1 ^ uVar4) & ((uint)(uVar5 >> 0x1d) & 7 ^ uVar3);
    }
    else {
      if ((int)uVar3 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar3 = Ssc_GiaSimulatePatternFraig_rec(p,uVar3 >> 1);
      if ((int)pObj->Value < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      uVar3 = pObj->Value & 1 ^ uVar3;
      uVar5 = *(ulong *)pObj;
    }
    uVar5 = uVar5 & 0xffffffffbfffffff | (ulong)(uVar3 << 0x1e);
    *(ulong *)pObj = uVar5;
  }
  return (uint)(uVar5 >> 0x1e) & 1;
}

Assistant:

int Ssc_GiaSimulatePattern_rec( Ssc_Man_t * p, Gia_Obj_t * pObj )
{
    int Res0, Res1;
    if ( Gia_ObjIsTravIdCurrent(p->pAig, pObj) )
        return pObj->fMark0;
    Gia_ObjSetTravIdCurrent(p->pAig, pObj);
    if ( ~pObj->Value )  // mapping into FRAIG exists - simulate FRAIG
    { 
        Res0 = Ssc_GiaSimulatePatternFraig_rec( p, Abc_Lit2Var(pObj->Value) );
        pObj->fMark0 = Res0 ^ Abc_LitIsCompl(pObj->Value);
    }
    else // mapping into FRAIG does not exist - simulate AIG
    {
        Res0 = Ssc_GiaSimulatePattern_rec( p, Gia_ObjFanin0(pObj) );
        Res1 = Ssc_GiaSimulatePattern_rec( p, Gia_ObjFanin1(pObj) );
        pObj->fMark0 = (Res0 ^ Gia_ObjFaninC0(pObj)) & (Res1 ^ Gia_ObjFaninC1(pObj));
    }
    return pObj->fMark0;
}